

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImVector<ImGuiGroupData> *this;
  ImVec2 *lhs;
  ImGuiItemStatusFlags *pIVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  bool bVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  char cVar10;
  ImGuiGroupData *pIVar11;
  ImGuiID IVar12;
  bool bVar13;
  uint uVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImRect group_bb;
  ImRect local_58;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar8 = GImGui;
  if ((GImGui->GroupStack).Size < 1) {
    __assert_fail("g.GroupStack.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1e48,"void ImGui::EndGroup()");
  }
  pIVar4 = GImGui->CurrentWindow;
  this = &GImGui->GroupStack;
  pIVar11 = ImVector<ImGuiGroupData>::back(this);
  if (pIVar11->WindowID != pIVar4->ID) {
    __assert_fail("group_data.WindowID == window->ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1e4b,"void ImGui::EndGroup()");
  }
  lhs = &(pIVar4->DC).CursorMaxPos;
  local_58.Max = ImMax(lhs,&pIVar11->BackupCursorPos);
  IVar5 = pIVar11->BackupCursorPos;
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_4_ = local_58.Max.x;
  local_48._4_4_ = local_58.Max.y;
  local_48._12_4_ = extraout_XMM0_Dd;
  (pIVar4->DC).CursorPos = IVar5;
  local_58.Min = IVar5;
  IVar6 = ImMax(&pIVar11->BackupCursorMaxPos,lhs);
  (pIVar4->DC).CursorMaxPos = IVar6;
  (pIVar4->DC).Indent.x = (pIVar11->BackupIndent).x;
  (pIVar4->DC).GroupOffset.x = (pIVar11->BackupGroupOffset).x;
  (pIVar4->DC).CurrLineSize = pIVar11->BackupCurrLineSize;
  fVar2 = pIVar11->BackupCurrLineTextBaseOffset;
  (pIVar4->DC).CurrLineTextBaseOffset = fVar2;
  if (pIVar8->LogEnabled == true) {
    pIVar8->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar11->EmitItem == false) {
    ImVector<ImGuiGroupData>::pop_back(this);
    return;
  }
  fVar3 = (pIVar4->DC).PrevLineTextBaseOffset;
  uVar14 = -(uint)(fVar2 <= fVar3);
  (pIVar4->DC).CurrLineTextBaseOffset = (float)(~uVar14 & (uint)fVar2 | (uint)fVar3 & uVar14);
  local_38.y = (float)local_48._4_4_ - IVar5.y;
  local_38.x = (float)local_48._0_4_ - IVar5.x;
  ItemSize(&local_38,-1.0);
  ItemAdd(&local_58,0,(ImRect *)0x0,0);
  IVar12 = pIVar8->ActiveId;
  if (pIVar11->BackupActiveIdIsAlive == IVar12) {
    if (pIVar11->BackupActiveIdPreviousFrameIsAlive == false) {
      cVar10 = pIVar8->ActiveIdPreviousFrameIsAlive;
joined_r0x00145a02:
      if (cVar10 != '\0') {
        IVar12 = pIVar8->ActiveIdPreviousFrame;
        cVar10 = '\x01';
        bVar9 = false;
        goto LAB_001459f4;
      }
    }
    bVar7 = false;
    cVar10 = '\0';
  }
  else {
    bVar13 = pIVar8->ActiveIdIsAlive != IVar12;
    if (pIVar11->BackupActiveIdPreviousFrameIsAlive == false) {
      cVar10 = pIVar8->ActiveIdPreviousFrameIsAlive;
      bVar9 = true;
      if (IVar12 == 0 || bVar13) goto joined_r0x00145a02;
    }
    else {
      cVar10 = '\0';
      bVar7 = false;
      bVar9 = true;
      if (IVar12 == 0 || bVar13) goto LAB_00145a08;
    }
LAB_001459f4:
    bVar7 = bVar9;
    (pIVar4->DC).LastItemId = IVar12;
  }
LAB_00145a08:
  (pIVar4->DC).LastItemRect.Min = local_58.Min;
  (pIVar4->DC).LastItemRect.Max = local_58.Max;
  if ((pIVar11->BackupHoveredIdIsAlive == false) && (pIVar8->HoveredId != 0)) {
    pIVar1 = &(pIVar4->DC).LastItemStatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar7) && (pIVar8->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar4->DC).LastItemStatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar14 = (pIVar4->DC).LastItemStatusFlags;
  (pIVar4->DC).LastItemStatusFlags = uVar14 | 0x20;
  if ((cVar10 != '\0') && (pIVar8->ActiveId != pIVar8->ActiveIdPreviousFrame)) {
    (pIVar4->DC).LastItemStatusFlags = uVar14 | 0x60;
  }
  ImVector<ImGuiGroupData>::pop_back(this);
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        window->DC.LastItemId = g.ActiveId;
    else if (group_contains_prev_active_id)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}